

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O3

LBBox3fa * __thiscall
embree::avx512::GridMeshISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,GridMeshISA *this,size_t buildID,BBox1f *time_range,
          SubGridBuildData *sgrids)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  size_t sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  undefined1 (*pauVar17) [16];
  long lVar18;
  long lVar19;
  ushort uVar20;
  ulong uVar21;
  ushort uVar22;
  ulong uVar23;
  BufferView<embree::Vec3fa> *pBVar24;
  BufferView<embree::Vec3fa> *pBVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar42;
  float fVar43;
  undefined1 auVar44 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar45;
  float fVar46;
  undefined1 auVar47 [16];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 in_XMM20 [16];
  
  uVar21 = (ulong)sgrids[buildID].sx & 0x7fff;
  uVar13 = (ulong)sgrids[buildID].sy & 0x7fff;
  lVar19 = (ulong)sgrids[buildID].primID * *(long *)&(this->super_GridMesh).field_0x68;
  fVar1 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
  fVar35 = (this->super_GridMesh).super_Geometry.time_range.lower;
  lVar4 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
  fVar46 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar35;
  fVar37 = (time_range->lower - fVar35) / fVar46;
  fVar46 = (time_range->upper - fVar35) / fVar46;
  fVar35 = fVar1 * fVar37;
  fVar39 = fVar1 * fVar46;
  auVar26 = vroundss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35),9);
  auVar27 = vroundss_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),10);
  auVar32._0_12_ = ZEXT812(0);
  auVar32._12_4_ = 0;
  auVar32 = vmaxss_avx(auVar26,auVar32);
  auVar34 = vminss_avx(auVar27,ZEXT416((uint)fVar1));
  iVar16 = -1;
  if (-1 < (int)auVar26._0_4_) {
    iVar16 = (int)auVar26._0_4_;
  }
  iVar8 = (int)fVar1 + 1;
  if ((int)auVar27._0_4_ < (int)fVar1 + 1) {
    iVar8 = (int)auVar27._0_4_;
  }
  uVar2 = *(ushort *)(lVar4 + 10 + lVar19);
  uVar23 = (ulong)uVar2;
  if (uVar13 + 3 < (ulong)uVar2) {
    uVar23 = uVar13 + 3;
  }
  uVar22 = (ushort)uVar13;
  fVar48 = auVar32._0_4_;
  fVar43 = auVar34._0_4_;
  uVar20 = (ushort)uVar21;
  if (uVar22 < uVar2) {
    lVar10 = (long)(int)fVar48;
    uVar15 = uVar21 + 3;
    uVar3 = *(ushort *)(lVar4 + 8 + lVar19);
    uVar12 = (ulong)uVar3;
    if (uVar15 < uVar3) {
      uVar12 = uVar15;
    }
    pBVar24 = (this->super_GridMesh).vertices.items;
    pBVar25 = pBVar24 + lVar10;
    auVar29._8_4_ = 0x7f800000;
    auVar29._0_8_ = 0x7f8000007f800000;
    auVar29._12_4_ = 0x7f800000;
    auVar27._8_4_ = 0xff800000;
    auVar27._0_8_ = 0xff800000ff800000;
    auVar27._12_4_ = 0xff800000;
    auVar30._8_4_ = 0xddccb9a2;
    auVar30._0_8_ = 0xddccb9a2ddccb9a2;
    auVar30._12_4_ = 0xddccb9a2;
    auVar59._8_4_ = 0x5dccb9a2;
    auVar59._0_8_ = 0x5dccb9a25dccb9a2;
    auVar59._12_4_ = 0x5dccb9a2;
    auVar52 = ZEXT1664(auVar27);
    auVar55 = ZEXT1664(auVar29);
    uVar14 = uVar13;
    do {
      if (uVar20 < uVar3) {
        sVar5 = (pBVar25->super_RawBufferView).stride;
        pauVar17 = (undefined1 (*) [16])
                   ((pBVar25->super_RawBufferView).ptr_ofs +
                   (*(uint *)(lVar4 + lVar19) + uVar21 + *(uint *)(lVar4 + 4 + lVar19) * uVar14) *
                   sVar5);
        lVar18 = uVar12 - uVar21;
        do {
          auVar26 = *pauVar17;
          uVar6 = vcmpps_avx512vl(auVar26,auVar30,6);
          uVar7 = vcmpps_avx512vl(auVar26,auVar59,1);
          auVar32 = auVar29;
          auVar34 = auVar27;
          if ((~((ushort)uVar6 & (ushort)uVar7) & 7) != 0) goto LAB_01f122ef;
          auVar32 = vminps_avx(auVar55._0_16_,auVar26);
          auVar55 = ZEXT1664(auVar32);
          auVar32 = vmaxps_avx(auVar52._0_16_,auVar26);
          auVar52 = ZEXT1664(auVar32);
          pauVar17 = (undefined1 (*) [16])(*pauVar17 + sVar5);
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      auVar34 = auVar52._0_16_;
      auVar32 = auVar55._0_16_;
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar23);
LAB_01f122ef:
    lVar18 = (long)(int)fVar43;
    pBVar24 = pBVar24 + lVar18;
    auVar52 = ZEXT1664(auVar27);
    auVar55 = ZEXT1664(auVar29);
    uVar14 = uVar13;
    do {
      if (uVar20 < uVar3) {
        sVar5 = (pBVar24->super_RawBufferView).stride;
        pauVar17 = (undefined1 (*) [16])
                   ((pBVar24->super_RawBufferView).ptr_ofs +
                   (*(uint *)(lVar4 + lVar19) + uVar21 + *(uint *)(lVar4 + 4 + lVar19) * uVar14) *
                   sVar5);
        lVar11 = uVar12 - uVar21;
        do {
          auVar26 = *pauVar17;
          uVar6 = vcmpps_avx512vl(auVar26,auVar30,6);
          uVar7 = vcmpps_avx512vl(auVar26,auVar59,1);
          auVar33 = auVar29;
          auVar56 = auVar27;
          if ((~((ushort)uVar6 & (ushort)uVar7) & 7) != 0) goto LAB_01f1237d;
          auVar31 = vminps_avx(auVar55._0_16_,auVar26);
          auVar55 = ZEXT1664(auVar31);
          auVar26 = vmaxps_avx(auVar52._0_16_,auVar26);
          auVar52 = ZEXT1664(auVar26);
          pauVar17 = (undefined1 (*) [16])(*pauVar17 + sVar5);
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      auVar56 = auVar52._0_16_;
      auVar33 = auVar55._0_16_;
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar23);
LAB_01f1237d:
    if (iVar8 - iVar16 != 1) {
      if (uVar22 < uVar2) {
        uVar3 = *(ushort *)(lVar4 + 8 + lVar19);
        uVar12 = (ulong)uVar3;
        if (uVar15 < uVar3) {
          uVar12 = uVar15;
        }
        pBVar25 = (this->super_GridMesh).vertices.items;
        auVar61._8_4_ = 0x7f800000;
        auVar61._0_8_ = 0x7f8000007f800000;
        auVar61._12_4_ = 0x7f800000;
        auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar52 = ZEXT1664(auVar26);
        auVar55 = ZEXT1664(auVar61);
        uVar15 = uVar13;
        do {
          if (uVar20 < uVar3) {
            sVar5 = pBVar25[lVar10 + 1].super_RawBufferView.stride;
            pauVar17 = (undefined1 (*) [16])
                       (pBVar25[lVar10 + 1].super_RawBufferView.ptr_ofs +
                       (*(uint *)(lVar4 + lVar19) + uVar21 + *(uint *)(lVar4 + 4 + lVar19) * uVar15)
                       * sVar5);
            lVar11 = uVar12 - uVar21;
            do {
              auVar29 = *pauVar17;
              uVar6 = vcmpps_avx512vl(auVar29,auVar30,6);
              uVar7 = vcmpps_avx512vl(auVar29,auVar59,1);
              auVar27 = auVar26;
              auVar31 = auVar61;
              if ((~((ushort)uVar6 & (ushort)uVar7) & 7) != 0) goto LAB_01f124f8;
              auVar27 = vminps_avx512vl(auVar55._0_16_,auVar29);
              auVar55 = ZEXT1664(auVar27);
              auVar27 = vmaxps_avx512vl(auVar52._0_16_,auVar29);
              auVar52 = ZEXT1664(auVar27);
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + sVar5);
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
          }
          auVar31 = auVar55._0_16_;
          auVar27 = auVar52._0_16_;
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar23);
LAB_01f124f8:
        auVar52 = ZEXT1664(auVar26);
        auVar55 = ZEXT1664(auVar61);
        uVar15 = uVar13;
        do {
          if (uVar20 < uVar3) {
            sVar5 = pBVar25[lVar18 + -1].super_RawBufferView.stride;
            pauVar17 = (undefined1 (*) [16])
                       (pBVar25[lVar18 + -1].super_RawBufferView.ptr_ofs +
                       (*(uint *)(lVar4 + lVar19) + uVar21 + *(uint *)(lVar4 + 4 + lVar19) * uVar15)
                       * sVar5);
            lVar10 = uVar12 - uVar21;
            do {
              auVar29 = *pauVar17;
              uVar6 = vcmpps_avx512vl(auVar29,auVar30,6);
              uVar7 = vcmpps_avx512vl(auVar29,auVar59,1);
              if ((~((ushort)uVar6 & (ushort)uVar7) & 7) != 0) goto LAB_01f12589;
              auVar28 = vminps_avx512vl(auVar55._0_16_,auVar29);
              auVar55 = ZEXT1664(auVar28);
              auVar29 = vmaxps_avx512vl(auVar52._0_16_,auVar29);
              auVar52 = ZEXT1664(auVar29);
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + sVar5);
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar23);
        auVar61 = auVar55._0_16_;
        auVar26 = auVar52._0_16_;
      }
      else {
        auVar31._8_4_ = 0x7f800000;
        auVar31._0_8_ = 0x7f8000007f800000;
        auVar31._12_4_ = 0x7f800000;
        auVar26._8_4_ = 0xff800000;
        auVar26._0_8_ = 0xff800000ff800000;
        auVar26._12_4_ = 0xff800000;
        auVar27 = auVar26;
        auVar61 = auVar31;
      }
LAB_01f12589:
      auVar30 = vmaxss_avx(ZEXT416((uint)(fVar35 - fVar48)),ZEXT816(0) << 0x40);
      fVar35 = 1.0 - auVar30._0_4_;
      auVar30 = vbroadcastss_avx512vl(auVar30);
      auVar31 = vmulps_avx512vl(auVar30,auVar31);
      auVar60._4_4_ = fVar35;
      auVar60._0_4_ = fVar35;
      auVar60._8_4_ = fVar35;
      auVar60._12_4_ = fVar35;
      auVar28 = vfmadd231ps_fma(auVar31,auVar60,auVar32);
      auVar32 = vmulps_avx512vl(auVar30,auVar27);
      auVar34 = vfmadd231ps_fma(auVar32,auVar60,auVar34);
      auVar32 = vmaxss_avx(ZEXT416((uint)(fVar43 - fVar39)),ZEXT816(0) << 0x40);
      fVar39 = auVar32._0_4_;
      fVar35 = 1.0 - fVar39;
      auVar50._4_4_ = fVar39;
      auVar50._0_4_ = fVar39;
      auVar50._8_4_ = fVar39;
      auVar50._12_4_ = fVar39;
      auVar41._0_4_ = auVar61._0_4_ * fVar39;
      auVar41._4_4_ = auVar61._4_4_ * fVar39;
      auVar41._8_4_ = auVar61._8_4_ * fVar39;
      auVar41._12_4_ = auVar61._12_4_ * fVar39;
      auVar53._4_4_ = fVar35;
      auVar53._0_4_ = fVar35;
      auVar53._8_4_ = fVar35;
      auVar53._12_4_ = fVar35;
      aVar42 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar41,auVar53,auVar33);
      auVar32 = vmulps_avx512vl(auVar50,auVar26);
      aVar45 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar32,auVar53,auVar56);
      if ((int)(iVar16 + 1U) < iVar8) {
        uVar15 = (ulong)(iVar16 + 1U);
        auVar51._8_4_ = 0x7f800000;
        auVar51._0_8_ = 0x7f8000007f800000;
        auVar51._12_4_ = 0x7f800000;
        auVar54._8_4_ = 0xff800000;
        auVar54._0_8_ = 0xff800000ff800000;
        auVar54._12_4_ = 0xff800000;
        auVar57._8_4_ = 0xddccb9a2;
        auVar57._0_8_ = 0xddccb9a2ddccb9a2;
        auVar57._12_4_ = 0xddccb9a2;
        auVar58._8_4_ = 0x5dccb9a2;
        auVar58._0_8_ = 0x5dccb9a25dccb9a2;
        auVar58._12_4_ = 0x5dccb9a2;
        auVar32 = auVar28;
        auVar26 = auVar34;
        aVar9 = aVar42;
        do {
          auVar34 = auVar51;
          auVar27 = auVar54;
          if (uVar22 < uVar2) {
            uVar3 = *(ushort *)(lVar4 + 8 + lVar19);
            uVar12 = (ulong)uVar3;
            if (uVar21 + 3 < (ulong)uVar3) {
              uVar12 = uVar21 + 3;
            }
            pBVar25 = (this->super_GridMesh).vertices.items + uVar15;
            auVar52 = ZEXT1664(auVar54);
            auVar55 = ZEXT1664(auVar51);
            uVar14 = uVar13;
            do {
              if (uVar20 < uVar3) {
                sVar5 = (pBVar25->super_RawBufferView).stride;
                pauVar17 = (undefined1 (*) [16])
                           ((pBVar25->super_RawBufferView).ptr_ofs +
                           (*(uint *)(lVar4 + lVar19) + uVar21 +
                           *(uint *)(lVar4 + 4 + lVar19) * uVar14) * sVar5);
                lVar10 = uVar12 - uVar21;
                do {
                  auVar31 = *pauVar17;
                  uVar6 = vcmpps_avx512vl(auVar31,auVar57,6);
                  uVar7 = vcmpps_avx512vl(auVar31,auVar58,1);
                  auVar34 = auVar51;
                  auVar27 = auVar54;
                  if ((~((ushort)uVar6 & (ushort)uVar7) & 7) != 0) goto LAB_01f126f0;
                  auVar34 = vminps_avx(auVar55._0_16_,auVar31);
                  auVar55 = ZEXT1664(auVar34);
                  auVar34 = vmaxps_avx(auVar52._0_16_,auVar31);
                  auVar52 = ZEXT1664(auVar34);
                  pauVar17 = (undefined1 (*) [16])(*pauVar17 + sVar5);
                  lVar10 = lVar10 + -1;
                } while (lVar10 != 0);
              }
              auVar27 = auVar52._0_16_;
              auVar34 = auVar55._0_16_;
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar23);
          }
LAB_01f126f0:
          auVar31 = vcvtsi2ss_avx512f(in_XMM20,(int)uVar15);
          auVar62._0_4_ = (auVar31._0_4_ / fVar1 - fVar37) / (fVar46 - fVar37);
          auVar62._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar31 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar62);
          auVar63._4_4_ = auVar62._0_4_;
          auVar63._0_4_ = auVar62._0_4_;
          auVar63._8_4_ = auVar62._0_4_;
          auVar63._12_4_ = auVar62._0_4_;
          auVar33 = vmulps_avx512vl((undefined1  [16])aVar9,auVar63);
          auVar31 = vbroadcastss_avx512vl(auVar31);
          auVar33 = vfmadd231ps_avx512vl(auVar33,auVar31,auVar32);
          auVar34 = vsubps_avx512vl(auVar34,auVar33);
          auVar64._0_4_ = auVar62._0_4_ * aVar45.m128[0];
          fVar35 = aVar45.m128[1];
          auVar64._4_4_ = auVar62._0_4_ * fVar35;
          fVar39 = aVar45.m128[2];
          auVar64._8_4_ = auVar62._0_4_ * fVar39;
          fVar43 = aVar45.m128[3];
          auVar64._12_4_ = auVar62._0_4_ * fVar43;
          auVar31 = vfmadd231ps_avx512vl(auVar64,auVar26,auVar31);
          auVar27 = vsubps_avx(auVar27,auVar31);
          auVar34 = vminps_avx(auVar34,ZEXT416(0) << 0x40);
          auVar27 = vmaxps_avx(auVar27,ZEXT416(0) << 0x40);
          auVar28._0_4_ = auVar34._0_4_ + auVar32._0_4_;
          auVar28._4_4_ = auVar34._4_4_ + auVar32._4_4_;
          auVar28._8_4_ = auVar34._8_4_ + auVar32._8_4_;
          auVar28._12_4_ = auVar34._12_4_ + auVar32._12_4_;
          aVar42._0_4_ = auVar34._0_4_ + aVar9.m128[0];
          aVar42._4_4_ = auVar34._4_4_ + aVar9.m128[1];
          aVar42._8_4_ = auVar34._8_4_ + aVar9.m128[2];
          aVar42._12_4_ = auVar34._12_4_ + aVar9.m128[3];
          auVar34._0_4_ = auVar27._0_4_ + auVar26._0_4_;
          auVar34._4_4_ = auVar27._4_4_ + auVar26._4_4_;
          auVar34._8_4_ = auVar27._8_4_ + auVar26._8_4_;
          auVar34._12_4_ = auVar27._12_4_ + auVar26._12_4_;
          aVar45._0_4_ = auVar27._0_4_ + aVar45.m128[0];
          aVar45._4_4_ = auVar27._4_4_ + fVar35;
          aVar45._8_4_ = auVar27._8_4_ + fVar39;
          aVar45._12_4_ = auVar27._12_4_ + fVar43;
          uVar15 = uVar15 + 1;
          auVar32 = auVar28;
          auVar26 = auVar34;
          aVar9 = aVar42;
        } while (iVar8 != (int)uVar15);
      }
      *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar28;
      *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar34;
      goto LAB_01f12769;
    }
  }
  else {
    auVar33._8_4_ = 0x7f800000;
    auVar33._0_8_ = 0x7f8000007f800000;
    auVar33._12_4_ = 0x7f800000;
    auVar56._8_4_ = 0xff800000;
    auVar56._0_8_ = 0xff800000ff800000;
    auVar56._12_4_ = 0xff800000;
    auVar32 = auVar33;
    auVar34 = auVar56;
    auVar26 = auVar56;
    auVar27 = auVar56;
    auVar31 = auVar33;
    auVar61 = auVar33;
    if (iVar8 - iVar16 != 1) goto LAB_01f12589;
  }
  auVar26 = vmaxss_avx(ZEXT416((uint)(fVar35 - fVar48)),ZEXT816(0));
  fVar35 = auVar26._0_4_;
  fVar1 = 1.0 - fVar35;
  auVar49._0_4_ = auVar33._0_4_ * fVar35;
  auVar49._4_4_ = auVar33._4_4_ * fVar35;
  auVar49._8_4_ = auVar33._8_4_ * fVar35;
  auVar49._12_4_ = auVar33._12_4_ * fVar35;
  auVar47._4_4_ = fVar1;
  auVar47._0_4_ = fVar1;
  auVar47._8_4_ = fVar1;
  auVar47._12_4_ = fVar1;
  aVar42 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar49,auVar47,auVar32);
  auVar36._0_4_ = auVar56._0_4_ * fVar35;
  auVar36._4_4_ = auVar56._4_4_ * fVar35;
  auVar36._8_4_ = auVar56._8_4_ * fVar35;
  auVar36._12_4_ = auVar56._12_4_ * fVar35;
  (__return_storage_ptr__->bounds0).lower.field_0 = aVar42;
  aVar42 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar36,auVar34,auVar47);
  (__return_storage_ptr__->bounds0).upper.field_0 = aVar42;
  auVar26 = vmaxss_avx(ZEXT416((uint)(fVar43 - fVar39)),ZEXT816(0));
  fVar35 = auVar26._0_4_;
  fVar1 = 1.0 - fVar35;
  auVar40._0_4_ = auVar32._0_4_ * fVar35;
  auVar40._4_4_ = auVar32._4_4_ * fVar35;
  auVar40._8_4_ = auVar32._8_4_ * fVar35;
  auVar40._12_4_ = auVar32._12_4_ * fVar35;
  auVar38._4_4_ = fVar1;
  auVar38._0_4_ = fVar1;
  auVar38._8_4_ = fVar1;
  auVar38._12_4_ = fVar1;
  aVar42 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar40,auVar38,auVar33);
  auVar44._0_4_ = fVar35 * auVar34._0_4_;
  auVar44._4_4_ = fVar35 * auVar34._4_4_;
  auVar44._8_4_ = fVar35 * auVar34._8_4_;
  auVar44._12_4_ = fVar35 * auVar34._12_4_;
  aVar45 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar44,auVar38,auVar56);
LAB_01f12769:
  (__return_storage_ptr__->bounds1).lower.field_0 = aVar42;
  (__return_storage_ptr__->bounds1).upper.field_0 = aVar45;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(size_t buildID, const BBox1f& time_range, const SubGridBuildData * const sgrids) const override {
        const SubGridBuildData &subgrid = sgrids[buildID];                      
        const unsigned int primID = subgrid.primID;
        const size_t x = subgrid.x();
        const size_t y = subgrid.y();
        return linearBounds(grid(primID),x,y,time_range);
      }